

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O3

void __thiscall
t_c_glib_generator::generate_service_helpers(t_c_glib_generator *this,t_service *tservice)

{
  pointer pcVar1;
  t_struct *ptVar2;
  long lVar3;
  t_program *program;
  t_type *type;
  t_field *elem;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  undefined4 extraout_var_01;
  undefined8 *puVar6;
  size_type *psVar7;
  pointer pptVar8;
  pointer pptVar9;
  string function_name;
  string arg_list_name_orig;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_field success;
  t_struct result;
  undefined1 *local_2b8;
  long local_2b0;
  undefined1 local_2a8 [16];
  string local_298;
  t_service *local_278;
  t_c_glib_generator *local_270;
  pointer local_268;
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  string local_240;
  string local_220;
  vector<t_function_*,_std::allocator<t_function_*>_> local_200;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_190 [7];
  e_req local_11c;
  t_struct local_f8;
  
  local_278 = tservice;
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_200,&tservice->functions_)
  ;
  if (local_200.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_200.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar8 = local_200.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_270 = this;
    do {
      local_2b8 = local_2a8;
      pcVar1 = ((*pptVar8)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,pcVar1,pcVar1 + ((*pptVar8)->name_)._M_string_length);
      ptVar2 = (*pptVar8)->arglist_;
      local_268 = pptVar8;
      iVar4 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
      local_260[0] = local_250;
      lVar3 = *(long *)CONCAT44(extraout_var,iVar4);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_260,lVar3,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar3);
      iVar4 = (*(local_278->super_t_type).super_t_doc._vptr_t_doc[3])();
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,local_2b8,local_2b8 + local_2b0);
      underscores_to_initial_caps(&local_298,&local_220);
      plVar5 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_298,0,(char *)0x0,
                                  *(ulong *)CONCAT44(extraout_var_00,iVar4));
      local_1a8._0_8_ = local_1a8 + 0x10;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        local_1a8._16_8_ = *psVar7;
        aaStack_190[0]._0_8_ = plVar5[3];
      }
      else {
        local_1a8._16_8_ = *psVar7;
        local_1a8._0_8_ = (size_type *)*plVar5;
      }
      local_1a8._8_8_ = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append(local_1a8);
      local_f8.super_t_type.super_t_doc._vptr_t_doc =
           (_func_int **)&local_f8.super_t_type.super_t_doc.doc_._M_string_length;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        local_f8.super_t_type.super_t_doc.doc_._M_string_length = *psVar7;
        local_f8.super_t_type.super_t_doc.doc_.field_2._M_allocated_capacity._0_4_ =
             (undefined4)plVar5[3];
        local_f8.super_t_type.super_t_doc.doc_.field_2._M_allocated_capacity._4_4_ =
             *(undefined4 *)((long)plVar5 + 0x1c);
      }
      else {
        local_f8.super_t_type.super_t_doc.doc_._M_string_length = *psVar7;
        local_f8.super_t_type.super_t_doc._vptr_t_doc = (_func_int **)*plVar5;
      }
      local_f8.super_t_type.super_t_doc.doc_._M_dataplus._M_p = (pointer)plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[2])(ptVar2,&local_f8);
      if (local_f8.super_t_type.super_t_doc._vptr_t_doc !=
          (_func_int **)&local_f8.super_t_type.super_t_doc.doc_._M_string_length) {
        operator_delete(local_f8.super_t_type.super_t_doc._vptr_t_doc);
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x15])(this,ptVar2);
      pptVar8 = local_268;
      (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[2])(ptVar2,local_260);
      if ((*pptVar8)->oneway_ == false) {
        program = (this->super_t_oop_generator).super_t_generator.program_;
        iVar4 = (*(local_278->super_t_type).super_t_doc._vptr_t_doc[3])();
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,local_2b8,local_2b8 + local_2b0);
        underscores_to_initial_caps(&local_1c8,&local_240);
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_1c8,0,(char *)0x0,
                                    *(ulong *)CONCAT44(extraout_var_01,iVar4));
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_298.field_2._M_allocated_capacity = *psVar7;
          local_298.field_2._8_8_ = plVar5[3];
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        }
        else {
          local_298.field_2._M_allocated_capacity = *psVar7;
          local_298._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_298._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
        local_1a8._0_8_ = local_1a8 + 0x10;
        psVar7 = puVar6 + 2;
        if ((size_type *)*puVar6 == psVar7) {
          local_1a8._16_8_ = *psVar7;
          aaStack_190[0]._0_8_ = puVar6[3];
        }
        else {
          local_1a8._16_8_ = *psVar7;
          local_1a8._0_8_ = (size_type *)*puVar6;
        }
        local_1a8._8_8_ = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        t_struct::t_struct(&local_f8,program,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p);
        }
        type = (*pptVar8)->returntype_;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"success","");
        t_field::t_field((t_field *)local_1a8,type,&local_1e8,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        local_11c = T_OPTIONAL;
        iVar4 = (*((*pptVar8)->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar4 == '\0') {
          t_struct::append(&local_f8,(t_field *)local_1a8);
        }
        ptVar2 = (*pptVar8)->xceptions_;
        for (pptVar9 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                       _M_impl.super__Vector_impl_data._M_start; this = local_270,
            pptVar9 !=
            (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish; pptVar9 = pptVar9 + 1) {
          elem = *pptVar9;
          elem->req_ = T_OPTIONAL;
          t_struct::append(&local_f8,elem);
        }
        (*(local_270->super_t_oop_generator).super_t_generator._vptr_t_generator[0x15])
                  (local_270,&local_f8);
        t_field::~t_field((t_field *)local_1a8);
        local_f8.super_t_type.super_t_doc._vptr_t_doc = (_func_int **)&PTR__t_struct_0040eeb8;
        if (local_f8.members_in_id_order_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.members_in_id_order_.
                          super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_f8.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.members_.
                          super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        t_type::~t_type(&local_f8.super_t_type);
      }
      if (local_260[0] != local_250) {
        operator_delete(local_260[0]);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8);
      }
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             local_200.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_200.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_c_glib_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator function_iter;

  // Iterate through the service's methods
  for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
    string function_name = (*function_iter)->get_name();
    t_struct* arg_list = (*function_iter)->get_arglist();
    string arg_list_name_orig = arg_list->get_name();

    // Generate the arguments class
    arg_list->set_name(tservice->get_name() + underscores_to_initial_caps(function_name) + "Args");
    generate_struct(arg_list);

    arg_list->set_name(arg_list_name_orig);

    // Generate the result class
    if (!(*function_iter)->is_oneway()) {
      t_struct result(program_,
                      tservice->get_name() + underscores_to_initial_caps(function_name) + "Result");
      t_field success((*function_iter)->get_returntype(), "success", 0);
      success.set_req(t_field::T_OPTIONAL);
      if (!(*function_iter)->get_returntype()->is_void()) {
        result.append(&success);
      }

      t_struct* xs = (*function_iter)->get_xceptions();
      const vector<t_field*>& fields = xs->get_members();
      vector<t_field*>::const_iterator field_iter;
      for (field_iter = fields.begin(); field_iter != fields.end(); ++field_iter) {
        (*field_iter)->set_req(t_field::T_OPTIONAL);
        result.append(*field_iter);
      }

      generate_struct(&result);
    }
  }
}